

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  int *piVar4;
  int iVar5;
  byte *pbVar6;
  
  bVar2 = *fmt;
  if (bVar2 != 0) {
    pbVar6 = (byte *)(fmt + 1);
    do {
      if (bVar2 < 0x32) {
        if (bVar2 != 0x20) {
          if (bVar2 != 0x31) {
            return;
          }
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar4 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar4 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar4 + 2;
          }
          iVar5 = *piVar4 << 0x18;
          goto LAB_0010d276;
        }
      }
      else {
        if (bVar2 == 0x32) {
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar4 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar4 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar4 + 2;
          }
          cVar3 = (char)*piVar4;
          iVar5 = *piVar4 << 0x10;
        }
        else {
          if (bVar2 != 0x34) {
            return;
          }
          uVar1 = v->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar4 = (int *)((ulong)uVar1 + (long)v->reg_save_area);
            v->gp_offset = uVar1 + 8;
          }
          else {
            piVar4 = (int *)v->overflow_arg_area;
            v->overflow_arg_area = piVar4 + 2;
          }
          iVar5 = *piVar4;
          fputc((int)(char)iVar5,(FILE *)f);
          fputc((int)(char)((uint)iVar5 >> 8),(FILE *)f);
          cVar3 = (char)((uint)iVar5 >> 0x10);
        }
        fputc((int)cVar3,(FILE *)f);
LAB_0010d276:
        fputc(iVar5 >> 0x18,(FILE *)f);
      }
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

static void writefv(FILE *f, char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { uint8 x = va_arg(v, int); write8(f,x); break; }
         case '2': { int16 x = va_arg(v, int); write8(f,x); write8(f,x>>8); break; }
         case '4': { int32 x = va_arg(v, int); write8(f,x); write8(f,x>>8); write8(f,x>>16); write8(f,x>>24); break; }
         default:
            assert(0);
            va_end(v);
            return;
      }
   }
}